

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::tab::normalize_ndf(tab *this)

{
  pointer pfVar1;
  pointer pvVar2;
  uint uVar3;
  ulong uVar4;
  vec2 vVar5;
  float fVar6;
  vec2 local_24;
  vec3 local_1c;
  
  local_24.x = 1.0;
  local_24.y = 1.0;
  local_1c.x = 0.0;
  local_1c.y = 0.0;
  local_1c.z = 1.0;
  vVar5 = cdfv(this,&local_24,&local_1c);
  if (0.0 < vVar5.x) {
    local_24.x = 1.0;
    local_24.y = 1.0;
    local_1c.x = 0.0;
    local_1c.y = 0.0;
    local_1c.z = 1.0;
    vVar5 = cdfv(this,&local_24,&local_1c);
    fVar6 = 1.0 / vVar5.x;
    pfVar1 = (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(this->m_ndf).super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        pfVar1[uVar4] = pfVar1[uVar4] * fVar6;
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
    pvVar2 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(this->m_cdf).
                                 super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar2) >> 3);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        pvVar2[uVar4].x = pvVar2[uVar4].x * fVar6;
        pvVar2[uVar4].y = pvVar2[uVar4].y * fVar6;
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
    fprintf(_stdout,"djb_verbose: NDF norm. constant = %.9f\n",(double)fVar6);
    return;
  }
  __assert_fail("cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && \"Invalid NDF normalization\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x850,"void djb::tab::normalize_ndf()");
}

Assistant:

void tab::normalize_ndf()
{
	DJB_ASSERT(cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && "Invalid NDF normalization");
	float_t nrm = 1 / cdf(vec2(1, 1), vec3(0, 0, 1));

	for (int i = 0; i < (int)m_ndf.size(); ++i)
		m_ndf[i]*= nrm;

	for (int i = 0; i < (int)m_cdf.size(); ++i)
		m_cdf[i]*= nrm;

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF norm. constant = %.9f\n", (double)nrm);
#endif
}